

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::DumpLibraryByteCode(JavascriptLibrary *this)

{
  bool bVar1;
  EngineInterfaceObject *this_00;
  EngineExtensionObjectBase *this_01;
  EngineExtensionObjectBase *engineExtension;
  uint i;
  JavascriptLibrary *this_local;
  
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,DumpFlag);
  if ((bVar1) && (bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea1258,JsLibInitPhase), bVar1)) {
    for (engineExtension._4_4_ = EngineInterfaceExtensionKind_JsBuiltIn;
        engineExtension._4_4_ <
        (EngineInterfaceExtensionKind_WinRTPromise|EngineInterfaceExtensionKind_Intl);
        engineExtension._4_4_ = engineExtension._4_4_ + EngineInterfaceExtensionKind_Intl) {
      this_00 = JavascriptLibraryBase::GetEngineInterfaceObject(&this->super_JavascriptLibraryBase);
      this_01 = EngineInterfaceObject::GetEngineExtension(this_00,engineExtension._4_4_);
      if ((this_01 != (EngineExtensionObjectBase *)0x0) &&
         (bVar1 = EngineExtensionObjectBase::GetHasByteCode(this_01), bVar1)) {
        (*this_01->_vptr_EngineExtensionObjectBase[1])();
      }
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::DumpLibraryByteCode()
    {
#if defined(ENABLE_JS_BUILTINS) || defined(ENABLE_INTL_OBJECT)
        // We aren't going to be passing in a number to check range of -dump:LibInit, that will be done by Intl/Promise
        // This is just to force init Intl code if dump:LibInit has been passed
        if (CONFIG_ISENABLED(DumpFlag) && Js::Configuration::Global.flags.Dump.IsEnabled(Js::JsLibInitPhase))
        {
            for (uint i = 0; i <= MaxEngineInterfaceExtensionKind; i++)
            {
                EngineExtensionObjectBase* engineExtension = this->GetEngineInterfaceObject()->GetEngineExtension((Js::EngineInterfaceExtensionKind)i);
                if (engineExtension != nullptr && engineExtension->GetHasByteCode())
                {
                    engineExtension->DumpByteCode();
                }
            }
        }
#endif
    }